

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_p1363_test.cc
# Opt level: O1

void __thiscall
ECDSAP1363Test_SignSucceedsWithLargeBuffer_Test::TestBody
          (ECDSAP1363Test_SignSucceedsWithLargeBuffer_Test *this)

{
  internal iVar1;
  void *pvVar2;
  int iVar3;
  EC_KEY *key_00;
  EC_GROUP *group;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar4;
  pointer pcVar5;
  char *message;
  char *in_R9;
  _Head_base<0UL,_ec_key_st_*,_false> expected_predicate_value;
  pointer *__ptr_5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar;
  size_t sig_len;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  UniquePtr<EC_KEY> key;
  size_t out_sig_len;
  uint8_t digest [20];
  AssertHelper local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  AssertHelper local_60;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  pointer local_48;
  _Head_base<0UL,_ec_key_st_*,_false> local_40;
  AssertHelper local_38;
  size_t local_30;
  uchar local_28 [24];
  
  iVar3 = RAND_bytes(local_28,0x14);
  iVar1 = (internal)(iVar3 != 0);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58[0] = iVar1;
  if (iVar3 == 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_80,(internal *)local_58,
               (AssertionResult *)"RAND_bytes(digest, sizeof(digest))","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
               ,0xa8,(char *)CONCAT71(local_80._1_7_,local_80[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_80._1_7_,local_80[0]),local_70._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_98.data_._1_7_,local_98.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_98.data_._1_7_,local_98.data_._0_1_) + 8))();
    }
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      return;
    }
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
    return;
  }
  key_00 = (EC_KEY *)EC_KEY_new();
  local_58[0] = (internal)(key_00 != (EC_KEY *)0x0);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40._M_head_impl = key_00;
  if (key_00 == (EC_KEY *)0x0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_80,(internal *)local_58,(AssertionResult *)0x607821,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
               ,0xab,(char *)CONCAT71(local_80._1_7_,local_80[0]));
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_98);
LAB_00279711:
    pdVar4 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_50;
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_80._1_7_,local_80[0]),local_70._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_98.data_._1_7_,local_98.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_98.data_._1_7_,local_98.data_._0_1_) + 8))();
    }
    local_78 = local_50;
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00279757;
  }
  else {
    group = EC_group_p256();
    iVar3 = EC_KEY_set_group((EC_KEY *)key_00,(EC_GROUP *)group);
    local_58[0] = (internal)(iVar3 != 0);
    local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 == 0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_80,(internal *)local_58,
                 (AssertionResult *)"EC_KEY_set_group(key.get(), EC_group_p256())","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                 ,0xac,(char *)CONCAT71(local_80._1_7_,local_80[0]));
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_98);
      goto LAB_00279711;
    }
    iVar3 = EC_KEY_generate_key((EC_KEY *)local_40._M_head_impl);
    local_58[0] = (internal)(iVar3 != 0);
    local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 == 0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_80,(internal *)local_58,
                 (AssertionResult *)"EC_KEY_generate_key(key.get())","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                 ,0xad,(char *)CONCAT71(local_80._1_7_,local_80[0]));
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_98);
      goto LAB_00279711;
    }
    local_60.data_ = (AssertHelperData *)ECDSA_size_p1363(local_40._M_head_impl);
    local_58._0_4_ = 0;
    testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
              ((internal *)local_80,"sig_len","0u",(unsigned_long *)&local_60,(uint *)local_58);
    if (local_80[0] != (internal)0x0) {
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_78,local_78);
      }
      local_80[0] = (internal)0x78;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,
                 (size_type)((long)&(local_60.data_)->type + 1),local_80,(allocator_type *)&local_98
                );
      expected_predicate_value._M_head_impl = local_40._M_head_impl;
      iVar3 = ECDSA_sign_p1363(local_28,0x14,(uint8_t *)CONCAT44(local_58._4_4_,local_58._0_4_),
                               &local_30,
                               (long)local_50 - (long)CONCAT44(local_58._4_4_,local_58._0_4_),
                               local_40._M_head_impl);
      local_98.data_._0_1_ = (allocator_type)(iVar3 != 0);
      local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&local_88);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_80,(internal *)&local_98,
                   (AssertionResult *)
                   "ECDSA_sign_p1363(digest, sizeof(digest), sig.data(), &out_sig_len, sig.size(), key.get())"
                   ,"false","true",(char *)expected_predicate_value._M_head_impl);
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                   ,0xb5,(char *)CONCAT71(local_80._1_7_,local_80[0]));
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_88);
LAB_002799a8:
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_80._1_7_,local_80[0]),local_70._M_allocated_capacity + 1
                         );
        }
        if (local_88._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_88._M_head_impl + 8))();
        }
LAB_002799dd:
        pdVar4 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90;
        local_78 = local_90;
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_002799ea:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(pdVar4,local_78);
        }
      }
      else {
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_80,"out_sig_len","sig_len",&local_30,(unsigned_long *)&local_60
                  );
        if (local_80[0] != (internal)0x0) {
          if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_78,local_78);
          }
          local_98.data_._0_1_ = (allocator_type)0x78;
          testing::internal::CmpHelperEQ<unsigned_char,char>
                    ((internal *)local_80,"sig.back()","\'x\'",
                     (uchar *)(local_50[-1].field_2._M_local_buf + 0xf),(char *)&local_98);
          if (local_80[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_98);
            if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              message = "";
            }
            else {
              message = (local_78->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_88,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                       ,0xb8,message);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_88,(Message *)&local_98);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
            if ((long *)CONCAT71(local_98.data_._1_7_,local_98.data_._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_98.data_._1_7_,local_98.data_._0_1_) + 8))();
            }
          }
          if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_78,local_78);
          }
          iVar3 = ECDSA_verify_p1363(local_28,0x14,
                                     (uint8_t *)CONCAT44(local_58._4_4_,local_58._0_4_),local_30,
                                     local_40._M_head_impl);
          local_98.data_._0_1_ = (allocator_type)(iVar3 != 0);
          local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_98.data_._0_1_) {
            testing::Message::Message((Message *)&local_88);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_80,(internal *)&local_98,
                       (AssertionResult *)
                       "ECDSA_verify_p1363(digest, sizeof(digest), sig.data(), out_sig_len, key.get())"
                       ,"false","true",(char *)expected_predicate_value._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                       ,0xbb,(char *)CONCAT71(local_80._1_7_,local_80[0]));
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_88);
            goto LAB_002799a8;
          }
          goto LAB_002799dd;
        }
        testing::Message::Message((Message *)&local_98);
        if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_78->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_88,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                   ,0xb6,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
        if ((long *)CONCAT71(local_98.data_._1_7_,local_98.data_._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_98.data_._1_7_,local_98.data_._0_1_) + 8))();
        }
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pdVar4 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78;
          goto LAB_002799ea;
        }
      }
      pvVar2 = (void *)CONCAT44(local_58._4_4_,local_58._0_4_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)local_48 - (long)pvVar2);
      }
      goto LAB_00279757;
    }
    testing::Message::Message((Message *)local_58);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
               ,0xb0,pcVar5);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
    }
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00279757;
    pdVar4 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_78;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(pdVar4,local_78);
LAB_00279757:
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&local_40);
  return;
}

Assistant:

TEST(ECDSAP1363Test, SignSucceedsWithLargeBuffer) {
  // Fill digest values with some random data.
  uint8_t digest[20];
  ASSERT_TRUE(RAND_bytes(digest, sizeof(digest)));

  bssl::UniquePtr<EC_KEY> key(EC_KEY_new());
  ASSERT_TRUE(key);
  ASSERT_TRUE(EC_KEY_set_group(key.get(), EC_group_p256()));
  ASSERT_TRUE(EC_KEY_generate_key(key.get()));

  size_t sig_len = ECDSA_size_p1363(key.get());
  ASSERT_GT(sig_len, 0u);
  std::vector<uint8_t> sig(sig_len + 1, 'x');

  size_t out_sig_len;
  ASSERT_TRUE(ECDSA_sign_p1363(digest, sizeof(digest), sig.data(),
                                &out_sig_len, sig.size(), key.get()));
  ASSERT_EQ(out_sig_len, sig_len);
  // The extra byte should be untouched.
  EXPECT_EQ(sig.back(), 'x');

  ASSERT_TRUE(ECDSA_verify_p1363(digest, sizeof(digest), sig.data(),
                                 out_sig_len, key.get()));
}